

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O0

uint64_t helper_pdist(uint64_t sum,uint64_t src1,uint64_t src2)

{
  undefined4 local_28;
  int s2;
  int s1;
  int i;
  uint64_t src2_local;
  uint64_t src1_local;
  uint64_t sum_local;
  
  src1_local = sum;
  for (s2 = 0; s2 < 8; s2 = s2 + 1) {
    local_28 = ((uint)(src1 >> (0x38U - (char)(s2 << 3) & 0x3f)) & 0xff) -
               ((uint)(src2 >> (0x38U - (char)(s2 << 3) & 0x3f)) & 0xff);
    if (local_28 < 0) {
      local_28 = -local_28;
    }
    src1_local = (long)local_28 + src1_local;
  }
  return src1_local;
}

Assistant:

uint64_t helper_pdist(uint64_t sum, uint64_t src1, uint64_t src2)
{
    int i;
    for (i = 0; i < 8; i++) {
        int s1, s2;

        s1 = (src1 >> (56 - (i * 8))) & 0xff;
        s2 = (src2 >> (56 - (i * 8))) & 0xff;

        /* Absolute value of difference. */
        s1 -= s2;
        if (s1 < 0) {
            s1 = -s1;
        }

        sum += s1;
    }

    return sum;
}